

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O0

mraa_result_t
mraa_intel_minnowboard_set_pininfo
          (mraa_board_t *board,int mraa_index,char *name,mraa_pincapabilities_t caps,int sysfs_pin,
          int chip,int line)

{
  int iVar1;
  mraa_pininfo_t *__dest;
  size_t sVar2;
  ushort **ppuVar3;
  uint local_3c;
  int controller;
  mraa_pininfo_t *pin_info;
  int chip_local;
  int sysfs_pin_local;
  char *name_local;
  int mraa_index_local;
  mraa_board_t *board_local;
  mraa_pincapabilities_t caps_local;
  
  if (mraa_index < board->phy_pin_count) {
    __dest = board->pins + mraa_index;
    strncpy(__dest->name,name,8);
    __dest->capabilities = caps;
    board_local._0_1_ = caps._0_1_;
    if (((byte)board_local >> 1 & 1) != 0) {
      (__dest->gpio).pinmap = sysfs_pin | arch_nr_gpios_adjust;
      (__dest->gpio).mux_total = 0;
      (__dest->gpio).gpio_chip = chip;
      (__dest->gpio).gpio_line = line;
    }
    if (((byte)board_local >> 5 & 1) != 0) {
      (__dest->i2c).pinmap = 1;
      (__dest->i2c).mux_total = 0;
    }
    if (((byte)board_local >> 2 & 1) != 0) {
      local_3c = 0;
      iVar1 = strncmp(name,"PWM",3);
      if (iVar1 == 0) {
        sVar2 = strlen(name);
        if (3 < sVar2) {
          ppuVar3 = __ctype_b_loc();
          if (((*ppuVar3)[(int)name[3]] & 0x800) != 0) {
            local_3c = (int)name[3] - 0x30;
          }
        }
      }
      (__dest->pwm).parent_id = local_3c;
      (__dest->pwm).pinmap = 0;
      (__dest->pwm).mux_total = 0;
    }
    if (((byte)board_local >> 4 & 1) != 0) {
      (__dest->spi).mux_total = 0;
    }
    board_local._4_4_ = MRAA_SUCCESS;
  }
  else {
    board_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  return board_local._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_minnowboard_set_pininfo(mraa_board_t* board, int mraa_index, char* name, mraa_pincapabilities_t caps, int sysfs_pin, int chip, int line)
{
    if (mraa_index < board->phy_pin_count) {
        // adjust mraa_index for ARCH_NR_GPIOS value
        mraa_pininfo_t* pin_info = &board->pins[mraa_index];
        strncpy(pin_info->name, name, MAX_LENGTH);
        pin_info->capabilities = caps;
        if (caps.gpio) {
            pin_info->gpio.pinmap = sysfs_pin | arch_nr_gpios_adjust;
            pin_info->gpio.mux_total = 0;
            pin_info->gpio.gpio_chip = chip;
            pin_info->gpio.gpio_line = line;
        }
        if (caps.i2c) {
            pin_info->i2c.pinmap = 1;
            pin_info->i2c.mux_total = 0;
        }
        if (caps.pwm) {
            int controller = 0;
            if (strncmp(name, "PWM", 3) == 0 && strlen(name) > 3 && isdigit(name[3]))
                controller = name[3] - '0';
            pin_info->pwm.parent_id = (unsigned int) controller;
            pin_info->pwm.pinmap = 0;
            pin_info->pwm.mux_total = 0;
        }
        if (caps.spi) {
            pin_info->spi.mux_total = 0;
        }
        return MRAA_SUCCESS;
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}